

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall google::protobuf::FieldDescriptor::InternalTypeOnceInit(FieldDescriptor *this)

{
  undefined4 uVar1;
  LogMessage *pLVar2;
  long lVar3;
  Symbol SVar4;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (*(char *)(*(long *)(this + 0x28) + 0x41) == '\0') {
    internal::LogMessage::LogMessage
              ((LogMessage *)&name,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1beb);
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)&name,"CHECK failed: file()->finished_building_ == true: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_30,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)&name);
  }
  if (*(string **)(this + 0x80) != (string *)0x0) {
    SVar4 = DescriptorPool::CrossLinkOnDemandHelper
                      (*(DescriptorPool **)(*(long *)(this + 0x28) + 0x10),*(string **)(this + 0x80)
                       ,false);
    if (SVar4.type == MESSAGE) {
      lVar3 = 0x68;
      uVar1 = 0xb;
    }
    else {
      if (SVar4.type != ENUM) goto LAB_00339b2a;
      lVar3 = 0x70;
      uVar1 = 0xe;
    }
    *(undefined4 *)(this + 0x38) = uVar1;
    *(anon_union_8_8_13f84498_for_Symbol_2 *)(this + lVar3) = SVar4.field_1;
  }
LAB_00339b2a:
  if ((*(long *)(this + 0x70) != 0) && (*(long *)(this + 0x90) == 0)) {
    if (*(long *)(this + 0x88) != 0) {
      std::__cxx11::string::string((string *)&name,*(string **)(*(long *)(this + 0x70) + 8));
      lVar3 = std::__cxx11::string::rfind((char)&name,0x2e);
      if (lVar3 == -1) {
        std::__cxx11::string::_M_assign((string *)&name);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&name);
        std::operator+(&local_50,&local_70,".");
        std::operator+(&local_30,&local_50,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (this + 0x88));
        std::__cxx11::string::operator=((string *)&name,(string *)&local_30);
        std::__cxx11::string::~string((string *)&local_30);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
      SVar4 = DescriptorPool::CrossLinkOnDemandHelper
                        (*(DescriptorPool **)(*(long *)(this + 0x28) + 0x10),&name,false);
      if (SVar4.type == ENUM_VALUE) {
        *(anon_union_8_8_13f84498_for_Symbol_2 *)(this + 0x90) = SVar4.field_1;
      }
      std::__cxx11::string::~string((string *)&name);
      if (*(long *)(this + 0x90) != 0) {
        return;
      }
    }
    lVar3 = *(long *)(this + 0x70);
    if (*(int *)(lVar3 + 0x2c) == 0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&name,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                 ,0x1c0b);
      pLVar2 = internal::LogMessage::operator<<
                         ((LogMessage *)&name,"CHECK failed: enum_type_->value_count(): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_30,pLVar2);
      internal::LogMessage::~LogMessage((LogMessage *)&name);
      lVar3 = *(long *)(this + 0x70);
    }
    *(undefined8 *)(this + 0x90) = *(undefined8 *)(lVar3 + 0x30);
  }
  return;
}

Assistant:

void FieldDescriptor::InternalTypeOnceInit() const {
  GOOGLE_CHECK(file()->finished_building_ == true);
  if (type_name_) {
    Symbol result = file()->pool()->CrossLinkOnDemandHelper(
        *type_name_, type_ == FieldDescriptor::TYPE_ENUM);
    if (result.type == Symbol::MESSAGE) {
      type_ = FieldDescriptor::TYPE_MESSAGE;
      message_type_ = result.descriptor;
    } else if (result.type == Symbol::ENUM) {
      type_ = FieldDescriptor::TYPE_ENUM;
      enum_type_ = result.enum_descriptor;
    }
  }
  if (enum_type_ && !default_value_enum_) {
    if (default_value_enum_name_) {
      // Have to build the full name now instead of at CrossLink time,
      // because enum_type_ may not be known at the time.
      std::string name = enum_type_->full_name();
      // Enum values reside in the same scope as the enum type.
      std::string::size_type last_dot = name.find_last_of('.');
      if (last_dot != std::string::npos) {
        name = name.substr(0, last_dot) + "." + *default_value_enum_name_;
      } else {
        name = *default_value_enum_name_;
      }
      Symbol result = file()->pool()->CrossLinkOnDemandHelper(name, true);
      if (result.type == Symbol::ENUM_VALUE) {
        default_value_enum_ = result.enum_value_descriptor;
      }
    }
    if (!default_value_enum_) {
      // We use the first defined value as the default
      // if a default is not explicitly defined.
      GOOGLE_CHECK(enum_type_->value_count());
      default_value_enum_ = enum_type_->value(0);
    }
  }
}